

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O0

DsList * ds_list_create(void)

{
  DsList *pDVar1;
  DsList *list;
  
  pDVar1 = (DsList *)malloc(0x18);
  if (pDVar1 == (DsList *)0x0) {
    exit(2);
  }
  pDVar1->entry = (DsListEntry *)0x0;
  pDVar1->equal = (_func_DS_BOOL_void_ptr_void_ptr *)0x0;
  pDVar1->size = 0;
  return pDVar1;
}

Assistant:

DsList *ds_list_create(void)
{
    DsList *list = (DsList *)malloc(sizeof(DsList));
    if (NULL == list)
        exit(DS_STATUS_OUTMEM);
    list->entry = NULL;
    list->equal = NULL;
    list->size = 0;
    return list;
}